

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error handleUnknownEncoding(XML_Parser parser,XML_Char *encodingName)

{
  int iVar1;
  long lVar2;
  XML_Error XVar3;
  code *pcVar4;
  undefined4 local_430 [256];
  undefined8 local_30;
  undefined8 uStack_28;
  code *local_20;
  
  pcVar4 = *(code **)((long)parser + 0xf0);
  XVar3 = XML_ERROR_UNKNOWN_ENCODING;
  if (pcVar4 != (code *)0x0) {
    for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
      local_430[lVar2] = 0xffffffff;
    }
    local_30 = 0;
    uStack_28 = 0;
    local_20 = (code *)0x0;
    iVar1 = (*pcVar4)(*(undefined8 *)((long)parser + 0x1e0));
    if (iVar1 != 0) {
      pcVar4 = *(code **)((long)parser + 0x18);
      iVar1 = cm_expat_XmlSizeOfUnknownEncoding();
      lVar2 = (*pcVar4)((long)iVar1);
      *(long *)((long)parser + 0x1d0) = lVar2;
      if (lVar2 == 0) {
        XVar3 = XML_ERROR_NO_MEMORY;
      }
      else {
        if (*(int *)((long)parser + 0x1c8) == 0) {
          pcVar4 = cm_expat_XmlInitUnknownEncoding;
        }
        else {
          pcVar4 = cm_expat_XmlInitUnknownEncodingNS;
        }
        lVar2 = (*pcVar4)(lVar2,local_430,uStack_28,local_30);
        if (lVar2 != 0) {
          *(undefined8 *)((long)parser + 0x1d8) = local_30;
          *(code **)((long)parser + 0x1e8) = local_20;
          *(long *)((long)parser + 0x118) = lVar2;
          return XML_ERROR_NONE;
        }
      }
    }
    if (local_20 != (code *)0x0) {
      (*local_20)(local_30);
    }
  }
  return XVar3;
}

Assistant:

static enum XML_Error
handleUnknownEncoding(XML_Parser parser, const XML_Char *encodingName)
{
  if (unknownEncodingHandler) {
    XML_Encoding info;
    int i;
    for (i = 0; i < 256; i++)
      info.map[i] = -1;
    info.convert = 0;
    info.data = 0;
    info.release = 0;
    if (unknownEncodingHandler(unknownEncodingHandlerData, encodingName, &info)) {
      ENCODING *enc;
      unknownEncodingMem = MALLOC(XmlSizeOfUnknownEncoding());
      if (!unknownEncodingMem) {
        if (info.release)
          info.release(info.data);
        return XML_ERROR_NO_MEMORY;
      }
      enc = (ns
             ? XmlInitUnknownEncodingNS
             : XmlInitUnknownEncoding)(unknownEncodingMem,
                                       info.map,
                                       info.convert,
                                       info.data);
      if (enc) {
        unknownEncodingData = info.data;
        unknownEncodingRelease = info.release;
        encoding = enc;
        return XML_ERROR_NONE;
      }
    }
    if (info.release)
      info.release(info.data);
  }
  return XML_ERROR_UNKNOWN_ENCODING;
}